

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O1

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
          *localGenerators)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmLocalGenerator *pcVar3;
  pointer puVar4;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> _Var5;
  bool bVar6;
  bool globalAutogenTarget;
  bool globalAutoRccTarget;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  TargetType TVar10;
  string *psVar11;
  const_iterator cVar12;
  string *psVar13;
  string *psVar14;
  cmQtAutoGenInitializer *this_01;
  bool bVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ulong in_R8;
  pointer puVar17;
  pointer puVar18;
  bool moc;
  pointer pcVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_200 [48];
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> local_1d0;
  _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
  *local_1c0;
  _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
  *local_1b8;
  string targetName;
  string local_100;
  string local_e0;
  size_type local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  pointer local_a0;
  string *local_98;
  string *local_90;
  pointer local_88;
  string msg;
  cmAlphaNum version;
  
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = (_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               *)&this->GlobalAutoGenTargets_;
  p_Var1 = &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c0 = (_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               *)&this->GlobalAutoRccTargets_;
  p_Var1 = &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CompilerFeatures_)._M_h._M_buckets = &(this->CompilerFeatures_)._M_h._M_single_bucket;
  (this->CompilerFeatures_)._M_h._M_bucket_count = 1;
  (this->CompilerFeatures_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CompilerFeatures_)._M_h._M_element_count = 0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CompilerFeatures_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Keywords::Keywords(&this->Keywords_);
  puVar17 = (localGenerators->
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (localGenerators->
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar17 != local_a0) {
    local_90 = &(this->Keywords_).AUTOUIC;
    local_98 = &(this->Keywords_).AUTORCC;
    local_a8 = &(this->Keywords_).AUTOMOC_EXECUTABLE;
    local_b0 = &(this->Keywords_).AUTOUIC_EXECUTABLE;
    local_b8 = &(this->Keywords_).AUTORCC_EXECUTABLE;
    do {
      pcVar19 = local_200 + 0x10;
      paVar16 = &targetName.field_2;
      this_00 = ((puVar17->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
      targetName._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetName,"CMAKE_GLOBAL_AUTOGEN_TARGET","");
      globalAutogenTarget = cmMakefile::IsOn(this_00,&targetName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetName._M_dataplus._M_p != paVar16) {
        operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
      }
      if (globalAutogenTarget) {
        local_200._0_8_ = pcVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_200,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME","");
        psVar11 = cmMakefile::GetSafeDefinition(this_00,(string *)local_200);
        pcVar2 = (psVar11->_M_dataplus)._M_p;
        targetName._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetName,pcVar2,pcVar2 + psVar11->_M_string_length);
        if ((pointer)local_200._0_8_ != pcVar19) {
          operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
        }
        if (targetName._M_string_length == 0) {
          in_R8 = 7;
          std::__cxx11::string::_M_replace((ulong)&targetName,0,(char *)0x0,0x6f6a34);
        }
        local_200._0_8_ =
             (puVar17->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        std::
        _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
        ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                  (local_1b8,(cmLocalGenerator **)local_200,&targetName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetName._M_dataplus._M_p != paVar16) {
          operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
        }
      }
      targetName._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetName,"CMAKE_GLOBAL_AUTORCC_TARGET","");
      globalAutoRccTarget = cmMakefile::IsOn(this_00,&targetName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetName._M_dataplus._M_p != paVar16) {
        operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
      }
      if (globalAutoRccTarget) {
        local_200._0_8_ = pcVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_200,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME","");
        psVar11 = cmMakefile::GetSafeDefinition(this_00,(string *)local_200);
        pcVar2 = (psVar11->_M_dataplus)._M_p;
        targetName._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetName,pcVar2,pcVar2 + psVar11->_M_string_length);
        if ((pointer)local_200._0_8_ != pcVar19) {
          operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
        }
        if (targetName._M_string_length == 0) {
          in_R8 = 7;
          std::__cxx11::string::_M_replace((ulong)&targetName,0,(char *)0x0,0x6f6a9a);
        }
        local_200._0_8_ =
             (puVar17->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        std::
        _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
        ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                  (local_1c0,(cmLocalGenerator **)local_200,&targetName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetName._M_dataplus._M_p != paVar16) {
          operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar3 = (puVar17->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      puVar4 = *(pointer *)
                ((long)&(pcVar3->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
      local_88 = puVar17;
      for (puVar18 = *(pointer *)
                      &(pcVar3->GeneratorTargets).
                       super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                       ._M_impl; puVar18 != puVar4; puVar18 = puVar18 + 1) {
        TVar10 = cmGeneratorTarget::GetType
                           ((cmGeneratorTarget *)
                            (puVar18->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           );
        if ((TVar10 < UTILITY) &&
           (bVar7 = cmGeneratorTarget::IsImported
                              ((cmGeneratorTarget *)
                               (puVar18->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ), !bVar7)) {
          cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_200,
                     (cmGeneratorTarget *)
                     (puVar18->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                    );
          cmGeneratorTarget::ClearSourcesCache
                    ((cmGeneratorTarget *)
                     (puVar18->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                    );
          targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&targetName,"CSharp","");
          cVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_200,&targetName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)targetName._M_dataplus._M_p != &targetName.field_2) {
            operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1
                           );
          }
          if (cVar12._M_node == (_Base_ptr)(local_200 + 8)) {
            bVar8 = cmGeneratorTarget::GetPropertyAsBool
                              ((cmGeneratorTarget *)
                               (puVar18->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ,&(this->Keywords_).AUTOMOC);
            bVar7 = cmGeneratorTarget::GetPropertyAsBool
                              ((cmGeneratorTarget *)
                               (puVar18->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ,local_90);
            bVar9 = cmGeneratorTarget::GetPropertyAsBool
                              ((cmGeneratorTarget *)
                               (puVar18->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ,local_98);
            if ((bVar8 || bVar7) || bVar9) {
              psVar11 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar18->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,local_a8);
              psVar13 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar18->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,local_b0);
              psVar14 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar18->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,local_b8);
              _Var5.
              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t
              .super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
              super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                   (puVar18->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
              ;
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              pcVar19 = (psVar11->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,pcVar19,pcVar19 + psVar11->_M_string_length);
              local_1d0 = cmQtAutoGenInitializer::GetQtVersion
                                    ((cmGeneratorTarget *)
                                     _Var5.
                                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl
                                     ,&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar20 = local_1d0.first.Major - 4 < 3;
              bVar21 = psVar11->_M_string_length != 0;
              bVar22 = psVar13->_M_string_length != 0;
              bVar23 = psVar14->_M_string_length != 0;
              bVar15 = (!bVar21 && !bVar20) && bVar8;
              moc = (!bVar22 && !bVar20) && bVar7;
              bVar6 = !bVar23;
              if (((bVar15) || (moc)) || ((bVar6 && !bVar20) && bVar9)) {
                if (local_1d0.second == 0) {
                  version.View_._M_len = 0xb;
                  version.View_._M_str = "<QTVERSION>";
                }
                else {
                  cmAlphaNum::cmAlphaNum(&version,local_1d0.second);
                }
                psVar11 = cmGeneratorTarget::GetName_abi_cxx11_
                                    ((cmGeneratorTarget *)
                                     (puVar18->_M_t).
                                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                    );
                pcVar19 = (psVar11->_M_dataplus)._M_p;
                local_c0 = psVar11->_M_string_length;
                cmQtAutoGen::Tools_abi_cxx11_
                          (&local_100,(cmQtAutoGen *)(ulong)bVar15,moc,(bVar6 && !bVar20) && bVar9,
                           SUB81(in_R8,0));
                targetName._M_dataplus._M_p = (pointer)0x2e;
                targetName._M_string_length = (size_type)anon_var_dwarf_727a6a;
                targetName.field_2._M_allocated_capacity = local_c0;
                views._M_len = 0xb;
                views._M_array = (iterator)&targetName;
                targetName.field_2._8_8_ = pcVar19;
                cmCatViews_abi_cxx11_(&msg,views);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                cmMakefile::IssueMessage
                          (*(cmMakefile **)
                            ((long)(puVar18->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            + 8),AUTHOR_WARNING,&msg);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
              }
              bVar8 = bVar8 && (bVar21 || bVar20);
              bVar7 = bVar7 && (bVar22 || bVar20);
              bVar9 = bVar9 && (bVar23 || bVar20);
              if ((bVar8 || bVar7) || bVar9) {
                _Var5.
                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                     (puVar18->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                ;
                this_01 = (cmQtAutoGenInitializer *)operator_new(0x948);
                in_R8 = (ulong)bVar8;
                cmQtAutoGenInitializer::cmQtAutoGenInitializer
                          (this_01,this,
                           (cmGeneratorTarget *)
                           _Var5.
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                           &local_1d0.first,bVar8,bVar7,bVar9,globalAutogenTarget,
                           globalAutoRccTarget);
                targetName._M_dataplus._M_p = (pointer)this_01;
                std::
                vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                ::
                emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                          ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                            *)this,(unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                                    *)&targetName);
                std::
                unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>::
                ~unique_ptr((unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                             *)&targetName);
              }
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_200);
        }
      }
      puVar17 = local_88 + 1;
    } while (puVar17 != local_a0);
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<std::unique_ptr<cmLocalGenerator>> const& localGenerators)
{
  for (const auto& localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTOGEN_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        this->GlobalAutoGenTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTORCC_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        this->GlobalAutoRccTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (const auto& target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }
      std::set<std::string> const& languages =
        target->GetAllConfigCompileLanguages();
      // cmGeneratorTarget::GetAllConfigCompileLanguages caches the target's
      // sources. Clear it so that OBJECT library targets that are AUTOGEN
      // initialized after this target get their added mocs_compilation.cpp
      // source acknowledged by this target.
      target->ClearSourcesCache();
      if (languages.count("CSharp")) {
        // Don't process target if it's a CSharp target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(this->kw().AUTOMOC);
      bool const uic = target->GetPropertyAsBool(this->kw().AUTOUIC);
      bool const rcc = target->GetPropertyAsBool(this->kw().AUTORCC);
      if (moc || uic || rcc) {
        std::string const& mocExec =
          target->GetSafeProperty(this->kw().AUTOMOC_EXECUTABLE);
        std::string const& uicExec =
          target->GetSafeProperty(this->kw().AUTOUIC_EXECUTABLE);
        std::string const& rccExec =
          target->GetSafeProperty(this->kw().AUTORCC_EXECUTABLE);

        // We support Qt4, Qt5 and Qt6
        auto qtVersion =
          cmQtAutoGenInitializer::GetQtVersion(target.get(), mocExec);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          cmAlphaNum version = (qtVersion.second == 0)
            ? cmAlphaNum("<QTVERSION>")
            : cmAlphaNum(qtVersion.second);
          cmAlphaNum component = uicDisabled ? "Widgets" : "Core";

          std::string const msg = cmStrCat(
            "AUTOGEN: No valid Qt version found for target ",
            target->GetName(), ".  ",
            cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled),
            " disabled.  Consider adding:\n", "  find_package(Qt", version,
            " COMPONENTS ", component, ")\n", "to your CMakeLists.txt file.");
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          this->Initializers_.emplace_back(
            cm::make_unique<cmQtAutoGenInitializer>(
              this, target.get(), qtVersion.first, mocIsValid, uicIsValid,
              rccIsValid, globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}